

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

char * make_METAL_destarg_assign(Context *ctx,char *buf,size_t buflen,char *fmt,...)

{
  char cVar1;
  ulong uVar2;
  char in_AL;
  uint uVar3;
  int iVar4;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_2b8 [32];
  undefined8 local_298;
  undefined8 local_290;
  undefined8 local_288;
  undefined8 local_278;
  undefined8 local_268;
  undefined8 local_258;
  undefined8 local_248;
  undefined8 local_238;
  undefined8 local_228;
  undefined8 local_218;
  char *local_208;
  char *rightparen;
  char *leftparen;
  ulong uStack_1f0;
  int scalar;
  size_t i;
  char *pcStack_1e0;
  char writemask_str [6];
  char *regtype_str;
  char regnum_str [16];
  char *result_shift_str;
  undefined4 local_1b8;
  int len;
  va_list ap;
  char local_198 [8];
  char operation [256];
  char *pcStack_88;
  int vecsize;
  char *clampright;
  char *clampleft;
  char clampbuf [32];
  DestArgInfo *arg;
  int need_parens;
  char *fmt_local;
  size_t buflen_local;
  char *buf_local;
  Context *ctx_local;
  
  if (in_AL != '\0') {
    local_288 = in_XMM0_Qa;
    local_278 = in_XMM1_Qa;
    local_268 = in_XMM2_Qa;
    local_258 = in_XMM3_Qa;
    local_248 = in_XMM4_Qa;
    local_238 = in_XMM5_Qa;
    local_228 = in_XMM6_Qa;
    local_218 = in_XMM7_Qa;
  }
  clampbuf._24_8_ = &ctx->dest_arg;
  if ((ctx->dest_arg).writemask == 0) {
    *buf = '\0';
  }
  else {
    local_298 = in_R8;
    local_290 = in_R9;
    memset(&clampleft,0,0x20);
    clampright = "";
    pcStack_88 = "";
    if ((*(uint *)(clampbuf._24_8_ + 0x28) & 1) != 0) {
      ctx->metal_need_header_common = 1;
      uVar3 = vecsize_from_writemask(*(int *)(clampbuf._24_8_ + 0x10));
      clampright = "clamp(";
      if (uVar3 == 1) {
        pcStack_88 = ", 0.0, 1.0)";
      }
      else {
        snprintf((char *)&clampleft,0x20,", float%d(0.0), float%d(1.0))",(ulong)uVar3,(ulong)uVar3);
        pcStack_88 = (char *)&clampleft;
      }
    }
    if ((*(uint *)(clampbuf._24_8_ + 0x28) & 4) != 0) {
      __assert_fail("(arg->result_mod & MOD_CENTROID) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                    ,0x105f,
                    "const char *make_METAL_destarg_assign(Context *, char *, const size_t, const char *, ...)"
                   );
    }
    if (ctx->predicated == 0) {
      ap[0].overflow_arg_area = local_2b8;
      ap[0]._0_8_ = &stack0x00000008;
      len = 0x30;
      local_1b8 = 0x20;
      uVar3 = vsnprintf(local_198,0x100,fmt,&local_1b8);
      if (uVar3 < 0x100) {
        regnum_str._8_8_ = (long)"\n\nUSAGE: %s <profile> [file1] ... [fileN]\n\n" + 0x2b;
        switch(*(undefined4 *)(clampbuf._24_8_ + 0x2c)) {
        case 1:
          regnum_str._8_8_ = anon_var_dwarf_3254;
          break;
        case 2:
          regnum_str._8_8_ = anon_var_dwarf_3260;
          break;
        case 3:
          regnum_str._8_8_ = anon_var_dwarf_326c;
          break;
        case 0xd:
          regnum_str._8_8_ = anon_var_dwarf_3278;
          break;
        case 0xe:
          regnum_str._8_8_ = anon_var_dwarf_3284;
          break;
        case 0xf:
          regnum_str._8_8_ = anon_var_dwarf_3290;
        }
        cVar1 = *(char *)regnum_str._8_8_;
        pcStack_1e0 = get_METAL_register_string
                                (ctx,*(RegisterType *)(clampbuf._24_8_ + 0x30),
                                 *(int *)(clampbuf._24_8_ + 8),(char *)&regtype_str,0x10);
        uStack_1f0 = 0;
        leftparen._4_4_ =
             isscalar(ctx,ctx->shader_type,*(RegisterType *)(clampbuf._24_8_ + 0x30),
                      *(int *)(clampbuf._24_8_ + 8));
        if ((leftparen._4_4_ == 0) &&
           (iVar4 = writemask_xyzw(*(int *)(clampbuf._24_8_ + 0x10)), iVar4 == 0)) {
          *(undefined1 *)((long)&i + uStack_1f0 + 2) = 0x2e;
          uVar2 = uStack_1f0 + 1;
          if (*(int *)(clampbuf._24_8_ + 0x14) != 0) {
            *(undefined1 *)((long)&i + uStack_1f0 + 3) = 0x78;
            uVar2 = uStack_1f0 + 2;
          }
          uStack_1f0 = uVar2;
          if (*(int *)(clampbuf._24_8_ + 0x18) != 0) {
            *(undefined1 *)((long)&i + uStack_1f0 + 2) = 0x79;
            uStack_1f0 = uStack_1f0 + 1;
          }
          if (*(int *)(clampbuf._24_8_ + 0x1c) != 0) {
            *(undefined1 *)((long)&i + uStack_1f0 + 2) = 0x7a;
            uStack_1f0 = uStack_1f0 + 1;
          }
          if (*(int *)(clampbuf._24_8_ + 0x20) != 0) {
            *(undefined1 *)((long)&i + uStack_1f0 + 2) = 0x77;
            uStack_1f0 = uStack_1f0 + 1;
          }
        }
        *(undefined1 *)((long)&i + uStack_1f0 + 2) = 0;
        if (5 < uStack_1f0) {
          __assert_fail("i < sizeof (writemask_str)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                        ,0x1090,
                        "const char *make_METAL_destarg_assign(Context *, char *, const size_t, const char *, ...)"
                       );
        }
        rightparen = "";
        if (cVar1 != '\0') {
          rightparen = "(";
        }
        local_208 = "";
        if (cVar1 != '\0') {
          local_208 = ")";
        }
        snprintf(buf,buflen,"%s%s%s = %s%s%s%s%s%s;",pcStack_1e0,&regtype_str,(long)&i + 2,
                 clampright,rightparen,local_198,local_208,regnum_str._8_8_,pcStack_88);
      }
      else {
        fail(ctx,"operation string too large");
        *buf = '\0';
      }
    }
    else {
      fail(ctx,"predicated destinations unsupported");
      *buf = '\0';
    }
  }
  return buf;
}

Assistant:

static const char *make_METAL_destarg_assign(Context *ctx, char *buf,
                                            const size_t buflen,
                                            const char *fmt, ...)
{
    int need_parens = 0;
    const DestArgInfo *arg = &ctx->dest_arg;

    if (arg->writemask == 0)
    {
        *buf = '\0';
        return buf;  // no writemask? It's a no-op.
    } // if

    char clampbuf[32] = { '\0' };
    const char *clampleft = "";
    const char *clampright = "";
    if (arg->result_mod & MOD_SATURATE)
    {
        ctx->metal_need_header_common = 1;
        const int vecsize = vecsize_from_writemask(arg->writemask);
        clampleft = "clamp(";
        if (vecsize == 1)
            clampright = ", 0.0, 1.0)";
        else
        {
            snprintf(clampbuf, sizeof (clampbuf),
                     ", float%d(0.0), float%d(1.0))", vecsize, vecsize);
            clampright = clampbuf;
        } // else
    } // if

    // MSDN says MOD_PP is a hint and many implementations ignore it. So do we.

    // CENTROID only allowed in DCL opcodes, which shouldn't come through here.
    assert((arg->result_mod & MOD_CENTROID) == 0);

    if (ctx->predicated)
    {
        fail(ctx, "predicated destinations unsupported");  // !!! FIXME
        *buf = '\0';
        return buf;
    } // if

    char operation[256];
    va_list ap;
    va_start(ap, fmt);
    const int len = vsnprintf(operation, sizeof (operation), fmt, ap);
    va_end(ap);
    if (len >= sizeof (operation))
    {
        fail(ctx, "operation string too large");  // I'm lazy.  :P
        *buf = '\0';
        return buf;
    } // if

    const char *result_shift_str = "";
    switch (arg->result_shift)
    {
        case 0x1: result_shift_str = " * 2.0"; break;
        case 0x2: result_shift_str = " * 4.0"; break;
        case 0x3: result_shift_str = " * 8.0"; break;
        case 0xD: result_shift_str = " / 8.0"; break;
        case 0xE: result_shift_str = " / 4.0"; break;
        case 0xF: result_shift_str = " / 2.0"; break;
    } // switch
    need_parens |= (result_shift_str[0] != '\0');

    char regnum_str[16];
    const char *regtype_str = get_METAL_register_string(ctx, arg->regtype,
                                                       arg->regnum, regnum_str,
                                                       sizeof (regnum_str));
    char writemask_str[6];
    size_t i = 0;
    const int scalar = isscalar(ctx, ctx->shader_type, arg->regtype, arg->regnum);
    if (!scalar && !writemask_xyzw(arg->writemask))
    {
        writemask_str[i++] = '.';
        if (arg->writemask0) writemask_str[i++] = 'x';
        if (arg->writemask1) writemask_str[i++] = 'y';
        if (arg->writemask2) writemask_str[i++] = 'z';
        if (arg->writemask3) writemask_str[i++] = 'w';
    } // if
    writemask_str[i] = '\0';
    assert(i < sizeof (writemask_str));

    const char *leftparen = (need_parens) ? "(" : "";
    const char *rightparen = (need_parens) ? ")" : "";

    snprintf(buf, buflen, "%s%s%s = %s%s%s%s%s%s;",
             regtype_str, regnum_str, writemask_str,
             clampleft, leftparen, operation, rightparen, result_shift_str,
             clampright);
    // !!! FIXME: make sure the scratch buffer was large enough.
    return buf;
}